

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::insert
          (QGenericArrayOps<QDockAreaLayoutItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QDockAreaLayoutItem *pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QDockAreaLayoutItem copy;
  Inserter local_a8;
  undefined1 local_58 [32];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutItem::QDockAreaLayoutItem((QDockAreaLayoutItem *)local_58,t);
  bVar3 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size != 0;
  QArrayDataPointer<QDockAreaLayoutItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QDockAreaLayoutItem>,(uint)(i == 0 && bVar3),n,
             (QDockAreaLayoutItem **)0x0,(QArrayDataPointer<QDockAreaLayoutItem> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      pQVar2 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
      do {
        QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar2 + -1,(QDockAreaLayoutItem *)local_58);
        pqVar1 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
        *pqVar1 = *pqVar1 + 1;
        pQVar2 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr + -1;
        (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr = pQVar2;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (QDockAreaLayoutItem *)0x0;
    local_a8.last = (QDockAreaLayoutItem *)0x0;
    local_a8.where = (QDockAreaLayoutItem *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
    local_a8.data = &this->super_QArrayDataPointer<QDockAreaLayoutItem>;
    Inserter::insert(&local_a8,i,(QDockAreaLayoutItem *)local_58,n);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this).insert(i, copy, n);
        }
    }